

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::OcclusionQueryTestInstance>::
initPrograms(QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::OcclusionQueryTestInstance>
             *this,SourceCollections *programCollection)

{
  ProgramSources *pPVar1;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [40];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"frag",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 400\nlayout(location = 0) out vec4 out_FragColor;\nvoid main()\n{\n\tout_FragColor = vec4(0.07, 0.48, 0.75, 1.0);\n}\n"
             ,&local_7a);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"vert",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 430\nlayout(location = 0) in vec4 in_Position;\nout gl_PerVertex { vec4 gl_Position; float gl_PointSize; };\nvoid main() {\n\tgl_Position  = in_Position;\n\tgl_PointSize = 1.0;\n}\n"
             ,&local_7a);
  glu::VertexSource::VertexSource((VertexSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void initPrograms(vk::SourceCollections& programCollection) const
	{
		programCollection.glslSources.add("frag") << glu::FragmentSource("#version 400\n"
																	   "layout(location = 0) out vec4 out_FragColor;\n"
																	   "void main()\n"
																	   "{\n"
																	   "	out_FragColor = vec4(0.07, 0.48, 0.75, 1.0);\n"
																	   "}\n");

		programCollection.glslSources.add("vert") << glu::VertexSource("#version 430\n"
																		 "layout(location = 0) in vec4 in_Position;\n"
																		 "out gl_PerVertex { vec4 gl_Position; float gl_PointSize; };\n"
																		 "void main() {\n"
																		 "	gl_Position  = in_Position;\n"
																		 "	gl_PointSize = 1.0;\n"
																		 "}\n");
	}